

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

WFile * open_existing_wfile(char *name,uint64_t *size)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  int *piVar3;
  undefined1 local_c0 [8];
  stat statbuf;
  WFile *ret;
  int fd;
  uint64_t *size_local;
  char *name_local;
  
  iVar1 = open(name,0x401);
  if (iVar1 < 0) {
    name_local = (char *)0x0;
  }
  else {
    statbuf.__glibc_reserved[2] = (__syscall_slong_t)safemalloc(1,0x10,0);
    *(int *)statbuf.__glibc_reserved[2] = iVar1;
    pcVar2 = dupstr(name);
    *(char **)(statbuf.__glibc_reserved[2] + 8) = pcVar2;
    if (size != (uint64_t *)0x0) {
      iVar1 = fstat(iVar1,(stat *)local_c0);
      __stream = _stderr;
      if (iVar1 < 0) {
        piVar3 = __errno_location();
        pcVar2 = strerror(*piVar3);
        fprintf(__stream,"%s: stat: %s\n",name,pcVar2);
        memset(local_c0,0,0x90);
      }
      *size = statbuf.st_rdev;
    }
    name_local = (char *)statbuf.__glibc_reserved[2];
  }
  return (WFile *)name_local;
}

Assistant:

WFile *open_existing_wfile(const char *name, uint64_t *size)
{
    int fd;
    WFile *ret;

    fd = open(name, O_APPEND | O_WRONLY);
    if (fd < 0)
        return NULL;

    ret = snew(WFile);
    ret->fd = fd;
    ret->name = dupstr(name);

    if (size) {
        struct stat statbuf;
        if (fstat(fd, &statbuf) < 0) {
            fprintf(stderr, "%s: stat: %s\n", name, strerror(errno));
            memset(&statbuf, 0, sizeof(statbuf));
        }

        *size = statbuf.st_size;
    }

    return ret;
}